

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

int WebPGetColorPalette(WebPPicture *pic,uint32_t *palette)

{
  uint uVar1;
  int iVar2;
  uint *puVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint8_t in_use [1024];
  uint32_t colors [1024];
  char local_1418 [1024];
  uint auStack_1018 [1024];
  
  uVar10 = 0;
  memset(local_1418,0,0x400);
  puVar3 = pic->argb;
  uVar8 = ~*puVar3;
  uVar5 = (ulong)(uint)pic->width;
  if (pic->width < 1) {
    uVar5 = uVar10;
  }
  iVar6 = pic->height;
  if (pic->height < 1) {
    iVar6 = 0;
  }
  iVar2 = 0;
  do {
    if ((int)uVar10 == iVar6) {
      if (palette != (uint32_t *)0x0) {
        iVar2 = 0;
        for (lVar4 = 0; lVar4 != 0x400; lVar4 = lVar4 + 1) {
          if (local_1418[lVar4] != '\0') {
            palette[iVar2] = auStack_1018[lVar4];
            iVar2 = iVar2 + 1;
          }
        }
      }
      return iVar2;
    }
    for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
      uVar1 = puVar3[uVar7];
      if (uVar1 != uVar8) {
        for (uVar9 = uVar1 * 0x1e35a7bd >> 0x16; uVar8 = uVar1, local_1418[uVar9] != '\0';
            uVar9 = uVar9 + 1 & 0x3ff) {
          if (auStack_1018[uVar9] == uVar1) goto LAB_00109435;
        }
        auStack_1018[uVar9] = uVar1;
        local_1418[uVar9] = '\x01';
        if (0xff < iVar2) {
          return 0x101;
        }
        iVar2 = iVar2 + 1;
      }
LAB_00109435:
    }
    puVar3 = puVar3 + pic->argb_stride;
    uVar10 = (ulong)((int)uVar10 + 1);
  } while( true );
}

Assistant:

int WebPGetColorPalette(const WebPPicture* const pic, uint32_t* const palette) {
  int i;
  int x, y;
  int num_colors = 0;
  uint8_t in_use[COLOR_HASH_SIZE] = { 0 };
  uint32_t colors[COLOR_HASH_SIZE];
  const uint32_t* argb = pic->argb;
  const int width = pic->width;
  const int height = pic->height;
  uint32_t last_pix = ~argb[0];   // so we're sure that last_pix != argb[0]
  assert(pic != NULL);
  assert(pic->use_argb);

  for (y = 0; y < height; ++y) {
    for (x = 0; x < width; ++x) {
      int key;
      if (argb[x] == last_pix) {
        continue;
      }
      last_pix = argb[x];
      key = VP8LHashPix(last_pix, COLOR_HASH_RIGHT_SHIFT);
      while (1) {
        if (!in_use[key]) {
          colors[key] = last_pix;
          in_use[key] = 1;
          ++num_colors;
          if (num_colors > MAX_PALETTE_SIZE) {
            return MAX_PALETTE_SIZE + 1;  // Exact count not needed.
          }
          break;
        } else if (colors[key] == last_pix) {
          break;  // The color is already there.
        } else {
          // Some other color sits here, so do linear conflict resolution.
          ++key;
          key &= (COLOR_HASH_SIZE - 1);  // Key mask.
        }
      }
    }
    argb += pic->argb_stride;
  }

  if (palette != NULL) {  // Fill the colors into palette.
    num_colors = 0;
    for (i = 0; i < COLOR_HASH_SIZE; ++i) {
      if (in_use[i]) {
        palette[num_colors] = colors[i];
        ++num_colors;
      }
    }
  }
  return num_colors;
}